

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O0

PList * p_list_append(PList *list,ppointer data)

{
  PList *local_30;
  PList *cur;
  PList *item;
  ppointer data_local;
  PList *list_local;
  
  list_local = (PList *)p_malloc0(0x10);
  if (list_local == (PList *)0x0) {
    printf("** Error: %s **\n","PList::p_list_append: failed to allocate memory");
    list_local = list;
  }
  else {
    list_local->data = data;
    local_30 = list;
    if (list != (PList *)0x0) {
      for (; local_30->next != (PList *)0x0; local_30 = local_30->next) {
      }
      local_30->next = list_local;
      list_local = list;
    }
  }
  return list_local;
}

Assistant:

P_LIB_API PList *
p_list_append (PList	*list,
	       ppointer	data)
{
	PList *item;
	PList *cur;

	if (P_UNLIKELY ((item = p_malloc0 (sizeof (PList))) == NULL)) {
		P_ERROR ("PList::p_list_append: failed to allocate memory");
		return list;
	}

	item->data = data;

	/* List is empty */
	if (P_UNLIKELY (list == NULL))
		return item;

	for (cur = list; cur->next != NULL; cur = cur->next)
		;
	cur->next = item;

	return list;
}